

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_permutations.c
# Opt level: O3

void ascon_permutation_6(ascon_sponge_t *sponge)

{
  ascon_round(sponge,0x96);
  ascon_round(sponge,0x87);
  ascon_round(sponge,'x');
  ascon_round(sponge,'i');
  ascon_round(sponge,'Z');
  ascon_round(sponge,'K');
  return;
}

Assistant:

ASCON_INLINE void
ascon_permutation_6(ascon_sponge_t* const sponge)
{
    ascon_round(sponge, ROUND_CONSTANT_07);
    ascon_round(sponge, ROUND_CONSTANT_08);
    ascon_round(sponge, ROUND_CONSTANT_09);
    ascon_round(sponge, ROUND_CONSTANT_10);
    ascon_round(sponge, ROUND_CONSTANT_11);
    ascon_round(sponge, ROUND_CONSTANT_12);
}